

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O1

EVaction INT_REVassoc_filter_action
                   (CMConnection conn,EVstone stone,FMStructDescList incoming_format_list,
                   char *handler,EVstone out_stone)

{
  int condition;
  CMFormat format;
  EVassoc_filter_action_request request;
  EV_int_response response;
  undefined8 local_58;
  char *pcStack_50;
  char *local_48;
  undefined8 uStack_40;
  undefined1 local_38 [4];
  EVaction local_34;
  
  local_48 = (char *)0x0;
  uStack_40 = 0;
  local_58 = 0;
  pcStack_50 = (char *)0x0;
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EVassoc_filter_action_req_formats);
  local_58._4_4_ = stone;
  pcStack_50 = get_format_name(conn->cm,incoming_format_list);
  uStack_40 = CONCAT44(uStack_40._4_4_,out_stone);
  local_58 = CONCAT44(local_58._4_4_,condition);
  local_48 = handler;
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EVassoc_filter_action_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,local_38);
  INT_CMwrite(conn,format,&local_58);
  INT_CMCondition_wait(conn->cm,condition);
  return local_34;
}

Assistant:

extern EVaction
INT_REVassoc_filter_action(CMConnection conn, EVstone stone, FMStructDescList incoming_format_list, char *handler, EVstone out_stone)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVassoc_filter_action_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVassoc_filter_action_req_formats);
    request.stone = stone;
    request.incoming_format_list = get_format_name(conn->cm, incoming_format_list);
    request.handler = handler;
    request.out_stone = out_stone;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVassoc_filter_action_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return (EVaction) response.ret;
}